

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iterator.cc
# Opt level: O0

void __thiscall
leveldb::Iterator::RegisterCleanup(Iterator *this,CleanupFunction func,void *arg1,void *arg2)

{
  bool bVar1;
  CleanupNode *local_30;
  CleanupNode *node;
  void *arg2_local;
  void *arg1_local;
  CleanupFunction func_local;
  Iterator *this_local;
  
  if (func != (CleanupFunction)0x0) {
    bVar1 = CleanupNode::IsEmpty(&this->cleanup_head_);
    if (bVar1) {
      local_30 = &this->cleanup_head_;
    }
    else {
      local_30 = (CleanupNode *)operator_new(0x20);
      memset(local_30,0,0x20);
      local_30->next = (this->cleanup_head_).next;
      (this->cleanup_head_).next = local_30;
    }
    local_30->function = func;
    local_30->arg1 = arg1;
    local_30->arg2 = arg2;
    return;
  }
  __assert_fail("func != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/table/iterator.cc"
                ,0x1b,"void leveldb::Iterator::RegisterCleanup(CleanupFunction, void *, void *)");
}

Assistant:

void Iterator::RegisterCleanup(CleanupFunction func, void* arg1, void* arg2) {
  assert(func != nullptr);
  CleanupNode* node;
  if (cleanup_head_.IsEmpty()) {
    node = &cleanup_head_;
  } else {
    node = new CleanupNode();
    node->next = cleanup_head_.next;
    cleanup_head_.next = node;
  }
  node->function = func;
  node->arg1 = arg1;
  node->arg2 = arg2;
}